

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O2

void __thiscall icu_63::DateFormatSymbols::disposeZoneStrings(DateFormatSymbols *this)

{
  UnicodeString *pUVar1;
  void *in_RSI;
  int32_t row_1;
  long lVar2;
  int32_t row;
  long lVar3;
  
  if (this->fZoneStrings != (UnicodeString **)0x0) {
    for (lVar3 = 0; lVar3 < this->fZoneStringsRowCount; lVar3 = lVar3 + 1) {
      pUVar1 = this->fZoneStrings[lVar3];
      if (pUVar1 != (UnicodeString *)0x0) {
        lVar2 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
        if (lVar2 != 0) {
          lVar2 = lVar2 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar2));
            lVar2 = lVar2 + -0x40;
          } while (lVar2 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
      }
    }
    uprv_free_63(this->fZoneStrings);
  }
  if (this->fLocaleZoneStrings != (UnicodeString **)0x0) {
    for (lVar3 = 0; lVar3 < this->fZoneStringsRowCount; lVar3 = lVar3 + 1) {
      pUVar1 = this->fLocaleZoneStrings[lVar3];
      if (pUVar1 != (UnicodeString *)0x0) {
        lVar2 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
        if (lVar2 != 0) {
          lVar2 = lVar2 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar2));
            lVar2 = lVar2 + -0x40;
          } while (lVar2 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
      }
    }
    uprv_free_63(this->fLocaleZoneStrings);
  }
  this->fZoneStrings = (UnicodeString **)0x0;
  this->fLocaleZoneStrings = (UnicodeString **)0x0;
  this->fZoneStringsRowCount = 0;
  this->fZoneStringsColCount = 0;
  return;
}

Assistant:

void DateFormatSymbols::disposeZoneStrings()
{
    if (fZoneStrings) {
        for (int32_t row = 0; row < fZoneStringsRowCount; ++row) {
            delete[] fZoneStrings[row];
        }
        uprv_free(fZoneStrings);
    }
    if (fLocaleZoneStrings) {
        for (int32_t row = 0; row < fZoneStringsRowCount; ++row) {
            delete[] fLocaleZoneStrings[row];
        }
        uprv_free(fLocaleZoneStrings);
    }

    fZoneStrings = NULL;
    fLocaleZoneStrings = NULL;
    fZoneStringsRowCount = 0;
    fZoneStringsColCount = 0;
}